

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_resolve(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue op1;
  JSValue this_obj;
  JSValue func_obj;
  JSValue v_04;
  int iVar1;
  BOOL BVar2;
  void *pvVar3;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar4;
  JSAtom in_stack_0000002c;
  JSContext *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  JSValue in_stack_00000048;
  BOOL is_same;
  JSValue ctor;
  BOOL is_reject;
  JSValue ret;
  JSValue resolving_funcs [2];
  JSValue result_promise;
  JSContext *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  int64_t in_stack_fffffffffffffef0;
  int64_t iVar6;
  JSValueUnion local_108;
  int64_t iVar7;
  JSValue in_stack_ffffffffffffff08;
  JSValueUnion in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  JSValueUnion in_stack_ffffffffffffff30;
  JSValue *in_stack_ffffffffffffff48;
  JSContext *in_stack_ffffffffffffff50;
  JSValue in_stack_ffffffffffffff58;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar4.tag = in_RDX;
  JVar4.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar4);
  if (iVar1 == 0) {
    JVar4 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x180e68);
    return JVar4;
  }
  if ((in_R9D == 0) && (pvVar3 = JS_GetOpaque(*in_R8,0x2a), pvVar3 != (void *)0x0)) {
    JVar4 = JS_GetPropertyInternal
                      (in_stack_00000030,in_stack_00000048,in_stack_0000002c,
                       (JSValue)in_stack_00000038,(BOOL)ctx);
    local_10 = JVar4.u;
    local_8 = JVar4.tag;
    in_stack_ffffffffffffff20 = local_8;
    in_stack_ffffffffffffff30 = local_10;
    iVar1 = JS_IsException(JVar4);
    if (iVar1 != 0) {
      local_38 = local_8;
      local_40.ptr = in_stack_ffffffffffffff30.ptr;
      return _local_40;
    }
    op1.tag = in_stack_ffffffffffffff20;
    op1.u.ptr = local_10.ptr;
    BVar2 = js_same_value((JSContext *)local_108,op1,in_stack_ffffffffffffff08);
    v.u._4_4_ = in_stack_fffffffffffffeec;
    v.u.int32 = in_stack_fffffffffffffee8;
    v.tag = in_stack_fffffffffffffef0;
    JS_FreeValue(in_stack_fffffffffffffee0,v);
    if (BVar2 != 0) {
      JVar4 = JS_DupValue(in_RDI,*in_R8);
      return JVar4;
    }
    in_stack_ffffffffffffff2c = 0;
    in_stack_ffffffffffffff18 = local_10;
  }
  _local_40 = js_new_promise_capability
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff58);
  JVar4 = _local_40;
  iVar1 = JS_IsException(_local_40);
  if (iVar1 == 0) {
    uVar5 = 0;
    iVar6 = 3;
    func_obj.u._4_4_ = in_stack_ffffffffffffff2c;
    func_obj.u.int32 = in_stack_ffffffffffffff28;
    func_obj.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
    this_obj.tag = in_stack_ffffffffffffff20;
    this_obj.u.float64 = in_stack_ffffffffffffff18.float64;
    JVar4 = JS_Call((JSContext *)JVar4.tag,func_obj,this_obj,JVar4.u._4_4_,
                    (JSValue *)in_stack_ffffffffffffff50);
    local_108 = JVar4.u;
    iVar7 = JVar4.tag;
    v_00.u._4_4_ = in_stack_fffffffffffffeec;
    v_00.u.int32 = uVar5;
    v_00.tag = iVar6;
    JS_FreeValue(in_stack_fffffffffffffee0,v_00);
    v_01.u._4_4_ = in_stack_fffffffffffffeec;
    v_01.u.int32 = uVar5;
    v_01.tag = iVar6;
    JS_FreeValue(in_stack_fffffffffffffee0,v_01);
    v_04.tag = iVar7;
    v_04.u.ptr = local_108.ptr;
    iVar1 = JS_IsException(v_04);
    if (iVar1 == 0) {
      v_03.u._4_4_ = in_stack_fffffffffffffeec;
      v_03.u.int32 = uVar5;
      v_03.tag = iVar6;
      JS_FreeValue(in_stack_fffffffffffffee0,v_03);
    }
    else {
      v_02.u._4_4_ = in_stack_fffffffffffffeec;
      v_02.u.int32 = uVar5;
      v_02.tag = iVar6;
      JS_FreeValue(in_stack_fffffffffffffee0,v_02);
      local_38 = iVar7;
      local_40.ptr = local_108.ptr;
    }
  }
  return _local_40;
}

Assistant:

static JSValue js_promise_resolve(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue result_promise, resolving_funcs[2], ret;
    BOOL is_reject = magic;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (!is_reject && JS_GetOpaque(argv[0], JS_CLASS_PROMISE)) {
        JSValue ctor;
        BOOL is_same;
        ctor = JS_GetProperty(ctx, argv[0], JS_ATOM_constructor);
        if (JS_IsException(ctor))
            return ctor;
        is_same = js_same_value(ctx, ctor, this_val);
        JS_FreeValue(ctx, ctor);
        if (is_same)
            return JS_DupValue(ctx, argv[0]);
    }
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    ret = JS_Call(ctx, resolving_funcs[is_reject], JS_UNDEFINED, 1, argv);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    if (JS_IsException(ret)) {
        JS_FreeValue(ctx, result_promise);
        return ret;
    }
    JS_FreeValue(ctx, ret);
    return result_promise;
}